

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int runQMake(int argc,char **argv)

{
  int *piVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  FILE *pFVar4;
  Data *pDVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  uint uVar9;
  iterator iVar10;
  iterator iVar11;
  ssize_t sVar12;
  MetaMakefileGenerator *pMVar13;
  code *pcVar14;
  QChar *pQVar15;
  char **argv_00;
  code *pcVar16;
  iterator copy;
  char *__s1;
  long in_FS_OFFSET;
  QLatin1String QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QStringView QVar20;
  bool success;
  QDir dir;
  QFileInfo fi;
  QMakeParser parser;
  ProFileCache proFileCache;
  QMakeVfs vfs;
  QMakeProject project;
  QMakeGlobals globals;
  DataPointer in_stack_fffffffffffff9b8;
  QString local_630;
  undefined1 local_618;
  undefined7 uStack_617;
  QString local_5e8;
  QArrayDataPointer<QString> local_5c8;
  undefined1 local_5a8 [16];
  QArrayData *local_598;
  BlockScope *pBStack_590;
  undefined1 *local_588;
  undefined1 *puStack_580;
  undefined1 *local_578;
  undefined1 *puStack_570;
  QArrayData *local_568;
  char16_t *pcStack_560;
  undefined1 *local_558;
  ProFileCache *pPStack_550;
  QMakeParserHandler *local_548;
  QMakeVfs *pQStack_540;
  ProFileCache local_530;
  QMakeProperty local_528;
  QString local_518;
  QMakeVfs local_4f9;
  QString local_4f8;
  code *local_4d8 [2];
  code *local_4c8;
  code *local_4c0;
  QArrayData *local_228;
  QArrayData *local_210;
  QMakeGlobals local_1f0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QHashSeed::setDeterministicGlobalSeed();
  setvbuf(_stdout,(char *)0x0,2,0);
  if (argc < 4) {
    if (1 < argc) {
      __s1 = argv[1];
      goto LAB_0029870f;
    }
  }
  else {
    __s1 = argv[1];
    iVar8 = strcmp(__s1,"-qtconf");
    if ((iVar8 == 0) && (iVar8 = strcmp(argv[3],"-install"), iVar8 == 0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        iVar8 = argc + -4;
        argv_00 = argv + 4;
        goto LAB_002987ed;
      }
      goto LAB_00299699;
    }
LAB_0029870f:
    iVar8 = strcmp(__s1,"-install");
    if (iVar8 == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        iVar8 = argc + -2;
        argv_00 = argv + 2;
LAB_002987ed:
        iVar8 = doInstall(iVar8,argv_00);
        return iVar8;
      }
      goto LAB_00299699;
    }
  }
  local_4f9 = (QMakeVfs)0xaa;
  QMakeVfs::QMakeVfs(&local_4f9);
  Option::vfs = &local_4f9;
  memset(&local_1f0,0xaa,0x1b8);
  QMakeGlobals::QMakeGlobals(&local_1f0);
  Option::globals = &local_1f0;
  uVar9 = Option::init((Option *)(ulong)(uint)argc,(EVP_PKEY_CTX *)argv);
  if (uVar9 == 0) {
    local_518.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_518.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_518.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    qmake_getpwd();
    QString::operator=(&Option::output_dir,(QString *)&local_518);
    QFile::fileName();
    if (local_4c8 == (code *)0x0) {
      bVar6 = false;
    }
    else {
      QFile::fileName();
      bVar6 = comparesEqual((QString *)local_5a8,"-");
      if ((ProFile *)local_5a8._0_8_ != (ProFile *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_5a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_5a8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_5a8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_5a8._0_8_,2,0x10);
        }
      }
      bVar6 = !bVar6;
    }
    if ((QArrayData *)local_4d8[0] != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_4d8[0] = *(int *)local_4d8[0] + -1;
      UNLOCK();
      if (*(int *)local_4d8[0] == 0) {
        QArrayData::deallocate((QArrayData *)local_4d8[0],2,0x10);
      }
    }
    if (bVar6) {
      local_5c8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      QFileInfo::QFileInfo((QFileInfo *)&local_5c8,(QFileDevice *)Option::output);
      local_5e8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      cVar7 = QFileInfo::isDir();
      if (cVar7 == '\0') {
        QFileInfo::absolutePath();
      }
      else {
        QFileInfo::absoluteFilePath();
      }
      QDir::cleanPath((QString *)((_Any_data *)local_4d8)->_M_pod_data);
      QDir::QDir((QDir *)&local_5e8,(QString *)((_Any_data *)local_4d8)->_M_pod_data);
      if ((QArrayData *)local_4d8[0] != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_4d8[0] = *(int *)local_4d8[0] + -1;
        UNLOCK();
        if (*(int *)local_4d8[0] == 0) {
          QArrayData::deallocate((QArrayData *)local_4d8[0],2,0x10);
        }
      }
      if ((ProFile *)local_5a8._0_8_ != (ProFile *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_5a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_5a8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_5a8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_5a8._0_8_,2,0x10);
        }
      }
      QDir::dirName();
      QVar17.m_data = (char *)0xa;
      QVar17.m_size = (qsizetype)local_4d8;
      cVar7 = QString::endsWith(QVar17,0x2abe4b);
      if ((QArrayData *)local_4d8[0] != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_4d8[0] = *(int *)local_4d8[0] + -1;
        UNLOCK();
        if (*(int *)local_4d8[0] == 0) {
          QArrayData::deallocate((QArrayData *)local_4d8[0],2,0x10);
        }
      }
      if (cVar7 != '\0') {
        QVar18.m_data = (storage_type *)0x2;
        QVar18.m_size = (qsizetype)local_4d8;
        QString::fromUtf8(QVar18);
        local_4f8.d.d = (Data *)local_4d8[0];
        local_4f8.d.ptr = (char16_t *)local_4d8[1];
        local_4f8.d.size = (qsizetype)local_4c8;
        QDir::filePath((QString *)local_5a8);
        QDir::cleanPath((QString *)((_Any_data *)local_4d8)->_M_pod_data);
        QDir::setPath((QString *)&local_5e8);
        if ((QArrayData *)local_4d8[0] != (QArrayData *)0x0) {
          LOCK();
          *(int *)local_4d8[0] = *(int *)local_4d8[0] + -1;
          UNLOCK();
          if (*(int *)local_4d8[0] == 0) {
            QArrayData::deallocate((QArrayData *)local_4d8[0],2,0x10);
          }
        }
        if ((ProFile *)local_5a8._0_8_ != (ProFile *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_5a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_5a8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_5a8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_5a8._0_8_,2,0x10);
          }
        }
        if (&(local_4f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_4f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_4f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_4f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_4f8.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      QDir::path();
      pcVar14 = local_4c8;
      pcVar16 = local_4d8[0];
      pcVar3 = Option::output_dir.d.ptr;
      pDVar2 = Option::output_dir.d.d;
      local_4d8[0] = (code *)Option::output_dir.d.d;
      Option::output_dir.d.d = (Data *)pcVar16;
      Option::output_dir.d.ptr = (char16_t *)local_4d8[1];
      local_4d8[1] = (code *)pcVar3;
      local_4c8 = (code *)Option::output_dir.d.size;
      Option::output_dir.d.size = (qsizetype)pcVar14;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar2->super_QArrayData,2,0x10);
        }
      }
      local_4c8 = (code *)&DAT_aaaaaaaaaaaaaaaa;
      local_4d8[0] = (code *)&DAT_aaaaaaaaaaaaaaaa;
      local_4d8[1] = (code *)&DAT_aaaaaaaaaaaaaaaa;
      QFileInfo::absoluteFilePath();
      QDir::cleanPath((QString *)((_Any_data *)local_4d8)->_M_pod_data);
      if ((ProFile *)local_5a8._0_8_ != (ProFile *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_5a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_5a8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_5a8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_5a8._0_8_,2,0x10);
        }
      }
      QString::mid((longlong)local_5a8,(longlong)local_4d8);
      QFile::setFileName((QString *)Option::output);
      if ((ProFile *)local_5a8._0_8_ != (ProFile *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_5a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_5a8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_5a8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_5a8._0_8_,2,0x10);
        }
      }
      if ((QArrayData *)local_4d8[0] != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_4d8[0] = *(int *)local_4d8[0] + -1;
        UNLOCK();
        if (*(int *)local_4d8[0] == 0) {
          QArrayData::deallocate((QArrayData *)local_4d8[0],2,0x10);
        }
      }
      QDir::~QDir((QDir *)&local_5e8);
      QFileInfo::~QFileInfo((QFileInfo *)&local_5c8);
    }
    local_528.settings = (QSettings *)&DAT_aaaaaaaaaaaaaaaa;
    local_528.m_values.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QMakeProperty::QMakeProperty(&local_528);
    if (Option::qmake_mode == QMAKE_SET_PROPERTY) {
      uVar9 = QMakeProperty::setProperty(&local_528,&Option::prop::properties);
    }
    else if (Option::qmake_mode == QMAKE_UNSET_PROPERTY) {
      QMakeProperty::unsetProperty(&local_528,&Option::prop::properties);
      uVar9 = 0;
    }
    else if (Option::qmake_mode == QMAKE_QUERY_PROPERTY) {
      local_4d8[1] = (code *)0x0;
      local_4d8[0] = qmakePropertyPrinter;
      local_4c0 = std::
                  _Function_handler<void_(const_QList<std::pair<QString,_QString>_>_&),_void_(*)(const_QList<std::pair<QString,_QString>_>_&)>
                  ::_M_invoke;
      local_4c8 = std::
                  _Function_handler<void_(const_QList<std::pair<QString,_QString>_>_&),_void_(*)(const_QList<std::pair<QString,_QString>_>_&)>
                  ::_M_manager;
      uVar9 = QMakeProperty::queryProperty
                        (&local_528,&Option::prop::properties,(PropertyPrinter *)local_4d8);
      if (local_4c8 != (code *)0x0) {
        (*local_4c8)((_Any_data *)local_4d8,(_Any_data *)local_4d8,3);
      }
    }
    else {
      local_530.parsed_files.d = (QHash<int,_ProFileCache::Entry>)&DAT_aaaaaaaaaaaaaaaa;
      local_1f0.property = &local_528;
      ProFileCache::ProFileCache(&local_530);
      local_548 = (QMakeParserHandler *)&DAT_aaaaaaaaaaaaaaaa;
      pQStack_540 = (QMakeVfs *)&DAT_aaaaaaaaaaaaaaaa;
      local_558 = &DAT_aaaaaaaaaaaaaaaa;
      pPStack_550 = (ProFileCache *)&DAT_aaaaaaaaaaaaaaaa;
      local_568 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      pcStack_560 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_578 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_570 = &DAT_aaaaaaaaaaaaaaaa;
      local_588 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_580 = &DAT_aaaaaaaaaaaaaaaa;
      local_598 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      pBStack_590 = (BlockScope *)&DAT_aaaaaaaaaaaaaaaa;
      local_5a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_5a8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      Option::proFileCache = &local_530;
      QMakeParser::QMakeParser
                ((QMakeParser *)local_5a8,&local_530,&local_4f9,
                 (QMakeParserHandler *)&Option::evalHandler);
      Option::parser = (QMakeParser *)local_5a8;
      memset((_Any_data *)local_4d8,0xaa,0x2e0);
      QMakeProject::QMakeProject((QMakeProject *)local_4d8);
      local_5c8.d = (Data *)0x0;
      local_5c8.ptr = (QString *)0x0;
      local_5c8.size = 0;
      if (Option::qmake_mode == QMAKE_GENERATE_PROJECT) {
        QVar19.m_data = &DAT_00000008;
        QVar19.m_size = (qsizetype)&local_4f8;
        QString::fromUtf8(QVar19);
        local_5e8.d.d = local_4f8.d.d;
        local_5e8.d.ptr = local_4f8.d.ptr;
        local_5e8.d.size = local_4f8.d.size;
        QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                  ((QMovableArrayOps<QString> *)&local_5c8,local_5c8.size,&local_5e8);
        QList<QString>::end((QList<QString> *)&local_5c8);
        if (&(local_5e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_5e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_5e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_5e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_5e8.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      else {
        QArrayDataPointer<QString>::operator=(&local_5c8,&Option::mkfile::project_files.d);
      }
      iVar10 = QList<QString>::begin((QList<QString> *)&local_5c8);
      iVar11 = QList<QString>::end((QList<QString> *)&local_5c8);
      if (iVar10.i == iVar11.i) {
        uVar9 = 0;
      }
      else {
        uVar9 = 0;
        do {
          if ((Option::qmake_mode & ~QMAKE_GENERATE_PROJECT) == QMAKE_GENERATE_MAKEFILE) {
            local_5e8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            local_5e8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_5e8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
            local_4f8.d.d = ((iVar10.i)->d).d;
            local_4f8.d.ptr = ((iVar10.i)->d).ptr;
            local_4f8.d.size = ((iVar10.i)->d).size;
            if (&(local_4f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              (((QArrayData *)&((local_4f8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
              super___atomic_base<int>._M_i =
                   (((QArrayData *)&((local_4f8.d.d)->super_QArrayData).ref_)->ref_)._q_value.
                   super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            Option::fixString(&local_5e8,(QString)in_stack_fffffffffffff9b8,(uchar)&local_4f8);
            if (&(local_4f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_4f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_4f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_4f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_4f8.d.d)->super_QArrayData,2,0x10);
              }
            }
            cVar7 = QFile::exists((QString *)&local_5e8);
            if (cVar7 == '\0') {
              runQMake();
              uVar9 = 2;
              bVar6 = false;
            }
            else {
              if (Option::debug_level != 0) {
                QDir::toNativeSeparators((QString *)&local_618);
                QString::toLatin1_helper_inplace((QString *)&local_4f8);
                pQVar15 = (QChar *)local_4f8.d.ptr;
                if ((QChar *)local_4f8.d.ptr == (QChar *)0x0) {
                  pQVar15 = (QChar *)&QByteArray::_empty;
                }
                debug_msg_internal(1,"Resetting dir to: %s",pQVar15);
                if (&(local_4f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_4f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_4f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_4f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate(&(local_4f8.d.d)->super_QArrayData,1,0x10);
                  }
                }
                piVar1 = (int *)CONCAT71(uStack_617,local_618);
                if (piVar1 != (int *)0x0) {
                  LOCK();
                  *piVar1 = *piVar1 + -1;
                  UNLOCK();
                  if (*piVar1 == 0) {
                    QArrayData::deallocate((QArrayData *)CONCAT71(uStack_617,local_618),2,0x10);
                  }
                }
              }
              qmake_setpwd(&local_518);
              pcVar16 = (code *)local_5e8.d.size;
              pcVar3 = local_5e8.d.ptr;
              pcVar14 = (code *)0x2f;
              QVar20.m_data = local_5e8.d.ptr;
              QVar20.m_size = local_5e8.d.size;
              iVar8 = QtPrivate::lastIndexOf(QVar20,-1,L'/',CaseSensitive);
              if (iVar8 != -1) {
                if (Option::debug_level != 0) {
                  if ((code *)(long)iVar8 < pcVar16) {
                    QString::QString(&local_630,(QChar *)pcVar3,(longlong)(long)iVar8);
                  }
                  else {
                    local_630.d.d = local_5e8.d.d;
                    local_630.d.ptr = pcVar3;
                    local_630.d.size = (qsizetype)pcVar16;
                    if (&(local_5e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_5e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_5e8.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + 1;
                      UNLOCK();
                    }
                  }
                  QDir::toNativeSeparators((QString *)&local_618);
                  QString::toLatin1_helper_inplace((QString *)&local_4f8);
                  pQVar15 = (QChar *)local_4f8.d.ptr;
                  if ((QChar *)local_4f8.d.ptr == (QChar *)0x0) {
                    pQVar15 = (QChar *)&QByteArray::_empty;
                  }
                  debug_msg_internal(1,"Changing dir to: %s",pQVar15);
                  if (&(local_4f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_4f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                         = ((local_4f8.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_4f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_4f8.d.d)->super_QArrayData,1,0x10);
                    }
                  }
                  piVar1 = (int *)CONCAT71(uStack_617,local_618);
                  if (piVar1 != (int *)0x0) {
                    LOCK();
                    *piVar1 = *piVar1 + -1;
                    UNLOCK();
                    if (*piVar1 == 0) {
                      QArrayData::deallocate((QArrayData *)CONCAT71(uStack_617,local_618),2,0x10);
                    }
                  }
                  pcVar16 = (code *)local_5e8.d.size;
                  if (&(local_630.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_630.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                         = ((local_630.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_630.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_630.d.d)->super_QArrayData,2,0x10);
                      pcVar16 = (code *)local_5e8.d.size;
                    }
                  }
                }
                pcVar14 = (code *)(long)iVar8;
                if (pcVar14 < pcVar16) {
                  QString::QString(&local_4f8,(QChar *)local_5e8.d.ptr,(longlong)pcVar14);
                }
                else {
                  local_4f8.d.d = local_5e8.d.d;
                  local_4f8.d.ptr = local_5e8.d.ptr;
                  local_4f8.d.size = (qsizetype)pcVar16;
                  if (&(local_5e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_5e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                         = ((local_5e8.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + 1;
                    UNLOCK();
                  }
                }
                bVar6 = qmake_setpwd(&local_4f8);
                if (&(local_4f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_4f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_4f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_4f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate(&(local_4f8.d.d)->super_QArrayData,2,0x10);
                  }
                }
                pFVar4 = _stderr;
                if (!bVar6) {
                  if (pcVar14 < (ulong)local_5e8.d.size) {
                    QString::QString(&local_630,(QChar *)local_5e8.d.ptr,(longlong)pcVar14);
                  }
                  else {
                    local_630.d.d = local_5e8.d.d;
                    local_630.d.ptr = local_5e8.d.ptr;
                    local_630.d.size = local_5e8.d.size;
                    if (&(local_5e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_5e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i = ((local_5e8.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + 1;
                      UNLOCK();
                    }
                  }
                  QDir::toNativeSeparators((QString *)&local_618);
                  QString::toLatin1_helper_inplace((QString *)&local_4f8);
                  pQVar15 = (QChar *)local_4f8.d.ptr;
                  if ((QChar *)local_4f8.d.ptr == (QChar *)0x0) {
                    pQVar15 = (QChar *)&QByteArray::_empty;
                  }
                  fprintf(pFVar4,"Cannot find directory: %s\n",pQVar15);
                  if (&(local_4f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_4f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                         = ((local_4f8.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_4f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_4f8.d.d)->super_QArrayData,1,0x10);
                    }
                  }
                  piVar1 = (int *)CONCAT71(uStack_617,local_618);
                  if (piVar1 != (int *)0x0) {
                    LOCK();
                    *piVar1 = *piVar1 + -1;
                    UNLOCK();
                    if (*piVar1 == 0) {
                      QArrayData::deallocate((QArrayData *)CONCAT71(uStack_617,local_618),2,0x10);
                    }
                  }
                  if (&(local_630.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_630.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                         = ((local_630.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_630.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_630.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                }
                if (CARRY8(~(ulong)pcVar14,local_5e8.d.size)) {
                  QString::QString(&local_4f8,(QChar *)(local_5e8.d.ptr + (long)(pcVar14 + 1)),
                                   (longlong)(local_5e8.d.size + ~(ulong)pcVar14));
                }
                else {
                  local_4f8.d.d = local_5e8.d.d;
                  local_4f8.d.ptr = local_5e8.d.ptr;
                  local_4f8.d.size = local_5e8.d.size;
                  if (&(local_5e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_5e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                         = ((local_5e8.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + 1;
                    UNLOCK();
                  }
                }
                pcVar14 = (code *)local_4f8.d.size;
                pDVar5 = local_4f8.d.d;
                pcVar3 = local_5e8.d.ptr;
                pDVar2 = local_5e8.d.d;
                local_4f8.d.d = local_5e8.d.d;
                local_5e8.d.d = pDVar5;
                local_5e8.d.ptr = local_4f8.d.ptr;
                local_4f8.d.ptr = pcVar3;
                local_4f8.d.size = local_5e8.d.size;
                local_5e8.d.size = (qsizetype)pcVar14;
                if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
                  UNLOCK();
                  if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                    QArrayData::deallocate(&pDVar2->super_QArrayData,2,0x10);
                  }
                }
              }
              Option::prepareProject(&local_5e8);
              sVar12 = QMakeProject::read((QMakeProject *)local_4d8,(int)&local_5e8,(void *)0x3,
                                          (size_t)pcVar14);
              if ((char)sVar12 == '\0') {
                runQMake();
                uVar9 = 3;
                bVar6 = false;
              }
              else {
                bVar6 = true;
                if (Option::mkfile::do_preprocess == true) {
                  QMakeProject::dump((QMakeProject *)local_4d8);
                  bVar6 = false;
                }
              }
            }
            if (&(local_5e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_5e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_5e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_5e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_5e8.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (bVar6) goto LAB_002992c9;
          }
          else {
LAB_002992c9:
            local_618 = (QString)0x1;
            local_4f8.d.d = (Data *)0x0;
            local_4f8.d.ptr = (char16_t *)0x0;
            local_4f8.d.size = 0;
            pMVar13 = MetaMakefileGenerator::createMetaGenerator
                                ((QMakeProject *)local_4d8,&local_4f8,false,(bool *)&local_618);
            if (&(local_4f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_4f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_4f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_4f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_4f8.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (local_618 == (QString)0x0) {
              uVar9 = 3;
            }
            if (pMVar13 != (MetaMakefileGenerator *)0x0) {
              iVar8 = (*pMVar13->_vptr_MetaMakefileGenerator[4])(pMVar13);
              pFVar4 = _stderr;
              if ((char)iVar8 == '\0') {
                if (Option::qmake_mode == QMAKE_GENERATE_PROJECT) {
                  runQMake();
                }
                else {
                  QDir::toNativeSeparators((QString *)&local_5e8);
                  QString::toLatin1_helper_inplace((QString *)&local_4f8);
                  pQVar15 = (QChar *)local_4f8.d.ptr;
                  if ((QChar *)local_4f8.d.ptr == (QChar *)0x0) {
                    pQVar15 = (QChar *)&QByteArray::_empty;
                  }
                  fprintf(pFVar4,"Unable to generate makefile for: %s\n",pQVar15);
                  if (&(local_4f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_4f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                         = ((local_4f8.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_4f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_4f8.d.d)->super_QArrayData,1,0x10);
                    }
                  }
                  if (&(local_5e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_5e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                         = ((local_5e8.d.d)->super_QArrayData).ref_._q_value.
                           super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if (((local_5e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_5e8.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                }
                uVar9 = 5;
              }
              (*pMVar13->_vptr_MetaMakefileGenerator[1])(pMVar13);
            }
          }
          iVar10.i = iVar10.i + 1;
          iVar11 = QList<QString>::end((QList<QString> *)&local_5c8);
        } while (iVar10.i != iVar11.i);
      }
      qmakeClearCaches();
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_5c8);
      if (local_210 != (QArrayData *)0x0) {
        LOCK();
        (local_210->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_210->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_210->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_210,2,0x10);
        }
      }
      if (local_228 != (QArrayData *)0x0) {
        LOCK();
        (local_228->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_228->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_228->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_228,2,0x10);
        }
      }
      QMakeEvaluator::~QMakeEvaluator((QMakeEvaluator *)local_4d8);
      if (local_568 != (QArrayData *)0x0) {
        LOCK();
        (local_568->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_568->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_568->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_568,2,0x10);
        }
      }
      if (local_598 != (QArrayData *)0x0) {
        LOCK();
        (local_598->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_598->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_598->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_598,0x10,0x10);
        }
      }
      ProFileCache::~ProFileCache(&local_530);
    }
    QMakeProperty::~QMakeProperty(&local_528);
    if (&(local_518.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_518.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_518.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_518.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_518.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    uVar9 = uVar9 >> 2 & 1;
  }
  QMakeGlobals::~QMakeGlobals(&local_1f0);
  QMakeVfs::~QMakeVfs(&local_4f9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar9;
  }
LAB_00299699:
  __stack_chk_fail();
}

Assistant:

int runQMake(int argc, char **argv)
{
    QHashSeed::setDeterministicGlobalSeed();

    // stderr is unbuffered by default, but stdout buffering depends on whether
    // there is a terminal attached. Buffering can make output from stderr and stdout
    // appear out of sync, so force stdout to be unbuffered as well.
    // This is particularly important for things like QtCreator and scripted builds.
    setvbuf(stdout, (char *)NULL, _IONBF, 0);

    // Workaround for inferior/missing command line tools on Windows: make our own!
    if (argc >= 4 && !strcmp(argv[1], "-qtconf") && !strcmp(argv[3], "-install"))
        return doInstall(argc - 4, argv + 4);
    if (argc >= 2 && !strcmp(argv[1], "-install"))
        return doInstall(argc - 2, argv + 2);

#ifdef Q_OS_WIN
    {
        // Support running as Visual C++'s compiler
        const wchar_t *cmdline = _wgetenv(L"MSC_CMD_FLAGS");
        if (!cmdline || !*cmdline)
            cmdline = _wgetenv(L"MSC_IDE_FLAGS");
        if (cmdline && *cmdline)
            return dumpMacros(cmdline);
    }
#endif

    QMakeVfs vfs;
    Option::vfs = &vfs;
    QMakeGlobals globals;
    Option::globals = &globals;

    // parse command line
    int ret = Option::init(argc, argv);
    if(ret != Option::QMAKE_CMDLINE_SUCCESS) {
        if ((ret & Option::QMAKE_CMDLINE_ERROR) != 0)
            return 1;
        return 0;
    }

    QString oldpwd = qmake_getpwd();

    Option::output_dir = oldpwd; //for now this is the output dir
    if (!Option::output.fileName().isEmpty() && Option::output.fileName() != "-") {
        // The output 'filename', as given by the -o option, might include one
        // or more directories, so we may need to rebase the output directory.
        QFileInfo fi(Option::output);

        QDir dir(QDir::cleanPath(fi.isDir() ? fi.absoluteFilePath() : fi.absolutePath()));

        // Don't treat Xcode project directory as part of OUT_PWD
        if (dir.dirName().endsWith(QLatin1String(".xcodeproj"))) {
            // Note: we're intentionally not using cdUp(), as the dir may not exist
            dir.setPath(QDir::cleanPath(dir.filePath("..")));
        }

        Option::output_dir = dir.path();
        QString absoluteFilePath = QDir::cleanPath(fi.absoluteFilePath());
        Option::output.setFileName(absoluteFilePath.mid(Option::output_dir.size() + 1));
    }

    QMakeProperty prop;
    switch (Option::qmake_mode) {
    case Option::QMAKE_QUERY_PROPERTY:
        return prop.queryProperty(Option::prop::properties);
    case Option::QMAKE_SET_PROPERTY:
        return prop.setProperty(Option::prop::properties);
    case Option::QMAKE_UNSET_PROPERTY:
        prop.unsetProperty(Option::prop::properties);
        return 0;
    default:
        break;
    }

    globals.setQMakeProperty(&prop);

    ProFileCache proFileCache;
    Option::proFileCache = &proFileCache;
    QMakeParser parser(&proFileCache, &vfs, &Option::evalHandler);
    Option::parser = &parser;

    QMakeProject project;
    int exit_val = 0;
    QStringList files;
    if(Option::qmake_mode == Option::QMAKE_GENERATE_PROJECT)
        files << "(*hack*)"; //we don't even use files, but we do the for() body once
    else
        files = Option::mkfile::project_files;
    for(QStringList::Iterator pfile = files.begin(); pfile != files.end(); pfile++) {
        if(Option::qmake_mode == Option::QMAKE_GENERATE_MAKEFILE ||
           Option::qmake_mode == Option::QMAKE_GENERATE_PRL) {
            QString fn = Option::normalizePath(*pfile);
            if(!QFile::exists(fn)) {
                fprintf(stderr, "Cannot find file: %s.\n",
                        QDir::toNativeSeparators(fn).toLatin1().constData());
                exit_val = 2;
                continue;
            }

            //setup pwd properly
            debug_msg(1, "Resetting dir to: %s",
                      QDir::toNativeSeparators(oldpwd).toLatin1().constData());
            qmake_setpwd(oldpwd); //reset the old pwd
            int di = fn.lastIndexOf(QLatin1Char('/'));
            if(di != -1) {
                debug_msg(1, "Changing dir to: %s",
                          QDir::toNativeSeparators(fn.left(di)).toLatin1().constData());
                if(!qmake_setpwd(fn.left(di)))
                    fprintf(stderr, "Cannot find directory: %s\n",
                            QDir::toNativeSeparators(fn.left(di)).toLatin1().constData());
                fn = fn.right(fn.size() - di - 1);
            }

            Option::prepareProject(fn);

            // read project..
            if(!project.read(fn)) {
                fprintf(stderr, "Error processing project file: %s\n",
                        QDir::toNativeSeparators(*pfile).toLatin1().constData());
                exit_val = 3;
                continue;
            }
            if (Option::mkfile::do_preprocess) {
                project.dump();
                continue; //no need to create makefile
            }
        }

        bool success = true;
        MetaMakefileGenerator *mkfile = MetaMakefileGenerator::createMetaGenerator(&project, QString(), false, &success);
        if (!success)
            exit_val = 3;

        if (mkfile && !mkfile->write()) {
            if(Option::qmake_mode == Option::QMAKE_GENERATE_PROJECT)
                fprintf(stderr, "Unable to generate project file.\n");
            else
                fprintf(stderr, "Unable to generate makefile for: %s\n",
                        QDir::toNativeSeparators(*pfile).toLatin1().constData());
            exit_val = 5;
        }
        delete mkfile;
        mkfile = nullptr;
    }
    qmakeClearCaches();
    return exit_val;
}